

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int fprintfConsumer(jx9_context *pCtx,char *zInput,int nLen,void *pUserData)

{
  long lVar1;
  jx9_int64 n;
  fprintf_data *pFdata;
  void *pUserData_local;
  int nLen_local;
  char *zInput_local;
  jx9_context *pCtx_local;
  
  lVar1 = (**(code **)(**pUserData + 0x40))(*(undefined8 *)(*pUserData + 8),zInput,(long)nLen);
  if (lVar1 < 1) {
    pCtx_local._4_4_ = -10;
  }
  else {
    *(long *)((long)pUserData + 8) = lVar1 + *(long *)((long)pUserData + 8);
    pCtx_local._4_4_ = 0;
  }
  return pCtx_local._4_4_;
}

Assistant:

static int fprintfConsumer(jx9_context *pCtx, const char *zInput, int nLen, void *pUserData)
{
	fprintf_data *pFdata = (fprintf_data *)pUserData;
	jx9_int64 n;
	/* Write the formatted data */
	n = pFdata->pIO->pStream->xWrite(pFdata->pIO->pHandle, (const void *)zInput, nLen);
	if( n < 1 ){
		SXUNUSED(pCtx); /* cc warning */
		/* IO error, abort immediately */
		return SXERR_ABORT;
	}
	/* Increment counter */
	pFdata->nCount += n;
	return JX9_OK;
}